

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImTriangleBarycentricCoords
               (ImVec2 *a,ImVec2 *b,ImVec2 *c,ImVec2 *p,float *out_u,float *out_v,float *out_w)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float *in_R8;
  float *in_R9;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  float *in_stack_00000008;
  float denom;
  ImVec2 v2;
  ImVec2 v1;
  ImVec2 v0;
  ImVec2 *in_stack_ffffffffffffffa8;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  auVar6._0_8_ = operator-(in_stack_ffffffffffffffa8,(ImVec2 *)0x41f646);
  auVar6._8_56_ = extraout_var;
  uVar1 = vmovlpd_avx(auVar6._0_16_);
  auVar7._0_8_ = operator-(in_stack_ffffffffffffffa8,(ImVec2 *)0x41f65b);
  auVar7._8_56_ = extraout_var_00;
  uVar2 = vmovlpd_avx(auVar7._0_16_);
  auVar8._0_8_ = operator-(in_stack_ffffffffffffffa8,(ImVec2 *)0x41f670);
  auVar8._8_56_ = extraout_var_01;
  uVar3 = vmovlpd_avx(auVar8._0_16_);
  local_38 = (uint)uVar1;
  uStack_3c = (uint)((ulong)uVar2 >> 0x20);
  local_40 = (float)uVar2;
  uStack_34 = (float)((ulong)uVar1 >> 0x20);
  auVar4 = vfmadd213ss_fma(ZEXT416(uStack_3c),ZEXT416(local_38),
                           ZEXT416((uint)-(local_40 * uStack_34)));
  local_48 = (float)uVar3;
  uStack_44 = (float)((ulong)uVar3 >> 0x20);
  auVar5 = vfmadd213ss_fma(ZEXT416(uStack_3c),ZEXT416((uint)local_48),
                           ZEXT416((uint)-(local_40 * uStack_44)));
  *in_R9 = auVar5._0_4_ / auVar4._0_4_;
  auVar5 = vfmadd213ss_fma(ZEXT416((uint)uStack_44),ZEXT416(local_38),
                           ZEXT416((uint)-(local_48 * uStack_34)));
  *in_stack_00000008 = auVar5._0_4_ / auVar4._0_4_;
  *in_R8 = (1.0 - *in_R9) - *in_stack_00000008;
  return;
}

Assistant:

void ImTriangleBarycentricCoords(const ImVec2& a, const ImVec2& b, const ImVec2& c, const ImVec2& p, float& out_u, float& out_v, float& out_w)
{
    ImVec2 v0 = b - a;
    ImVec2 v1 = c - a;
    ImVec2 v2 = p - a;
    const float denom = v0.x * v1.y - v1.x * v0.y;
    out_v = (v2.x * v1.y - v1.x * v2.y) / denom;
    out_w = (v0.x * v2.y - v2.x * v0.y) / denom;
    out_u = 1.0f - out_v - out_w;
}